

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double orient4dadapt(double *pa,double *pb,double *pc,double *pd,double *pe,double aheight,
                    double bheight,double cheight,double dheight,double eheight,double permanent)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int elen;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar41;
  double dVar42;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dStack_17a0;
  double dStack_1780;
  double dStack_1740;
  double dStack_1730;
  double dStack_1720;
  double dStack_16c0;
  double dStack_16a0;
  double local_14f8;
  double dStack_14f0;
  undefined1 local_14e8 [16];
  double local_14d8;
  double dStack_14d0;
  double local_14c8;
  double local_14c0;
  double local_14b8;
  double dStack_14b0;
  undefined1 local_14a8 [16];
  double temp8b [8];
  double local_1458;
  double dStack_1450;
  double local_1448;
  double dStack_1440;
  double local_1438;
  double dStack_1430;
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  double local_1408;
  double local_1400;
  double temp8c [8];
  double temp16 [16];
  double temp8a [8];
  double temp24 [24];
  double cdet [48];
  double bdet [48];
  double adet [48];
  double ddet [48];
  double cddet [96];
  double abdet [96];
  double fin1 [192];
  
  dVar57 = *pe;
  dVar56 = pe[1];
  dVar64 = *pa;
  dVar43 = pa[1];
  dVar24 = dVar64 - dVar57;
  dVar32 = dVar43 - dVar56;
  dVar45 = *pb;
  dVar51 = pb[1];
  dVar27 = dVar45 - dVar57;
  dVar18 = dVar51 - dVar56;
  auVar29._8_4_ = SUB84(dVar18,0);
  auVar29._0_8_ = dVar27;
  auVar29._12_4_ = (int)((ulong)dVar18 >> 0x20);
  dVar15 = dVar18 * splitter - (dVar18 * splitter - dVar18);
  dVar21 = dVar27 * splitter - (dVar27 * splitter - dVar27);
  dVar33 = dVar24 * splitter - (dVar24 * splitter - dVar24);
  dVar41 = dVar32 * splitter - (dVar32 * splitter - dVar32);
  dVar16 = dVar18 * dVar24;
  dVar22 = dVar27 * dVar32;
  dVar46 = dVar24 - dVar33;
  dVar49 = dVar32 - dVar41;
  dVar58 = dVar18 - dVar15;
  dVar60 = dVar27 - dVar21;
  auVar7._8_4_ = SUB84(dVar60,0);
  auVar7._0_8_ = dVar46;
  auVar7._12_4_ = (int)((ulong)dVar60 >> 0x20);
  dVar61 = dVar58 * dVar46 - (((dVar16 - dVar33 * dVar15) - dVar46 * dVar15) - dVar58 * dVar33);
  dVar63 = dVar60 * dVar49 - (((dVar22 - dVar21 * dVar41) - dVar60 * dVar41) - dVar49 * dVar21);
  dVar47 = dVar61 - dVar63;
  dVar26 = dVar16 + dVar47;
  dVar34 = (dVar16 - (dVar26 - (dVar26 - dVar16))) + (dVar47 - (dVar26 - dVar16));
  dVar35 = dVar34 - dVar22;
  dVar6 = pa[2];
  dVar16 = pb[2];
  local_14b8 = (dVar61 - (dVar47 + (dVar61 - dVar47))) + ((dVar61 - dVar47) - dVar63);
  dStack_14b0 = (dVar34 - (dVar35 + (dVar34 - dVar35))) + ((dVar34 - dVar35) - dVar22);
  dVar59 = pc[2];
  dVar61 = pd[2];
  dVar66 = *pc;
  dVar68 = pc[1];
  dVar70 = *pd;
  dVar72 = pd[1];
  dVar63 = pe[2];
  dVar25 = dVar26 + dVar35;
  local_14a8._8_4_ = SUB84(dVar25,0);
  local_14a8._0_8_ = (dVar26 - (dVar25 - (dVar25 - dVar26))) + (dVar35 - (dVar25 - dVar26));
  local_14a8._12_4_ = (int)((ulong)dVar25 >> 0x20);
  dVar53 = dVar66 - dVar57;
  dVar55 = dVar68 - dVar56;
  dVar65 = dVar53 * splitter - (dVar53 * splitter - dVar53);
  dVar67 = dVar55 * splitter - (dVar55 * splitter - dVar55);
  dVar48 = dVar72 - dVar56;
  dVar50 = dVar70 - dVar57;
  dVar34 = splitter * dVar48 - (splitter * dVar48 - dVar48);
  dVar22 = splitter * dVar50 - (splitter * dVar50 - dVar50);
  dVar33 = -dVar33;
  dVar21 = -dVar21;
  dVar36 = -dVar65;
  dVar42 = -dVar22;
  dVar69 = dVar53 - dVar65;
  dVar71 = dVar55 - dVar67;
  dVar73 = dVar48 - dVar34;
  dVar74 = dVar50 - dVar22;
  dStack_1780 = auVar7._8_8_;
  dVar17 = -dVar46;
  dVar23 = -dStack_1780;
  auVar39._8_4_ = SUB84(dVar22 * dVar67,0);
  auVar39._0_8_ = dVar65 * dVar34;
  auVar39._12_4_ = (int)((ulong)(dVar22 * dVar67) >> 0x20);
  auVar40._8_4_ = SUB84(dVar74,0);
  auVar40._0_8_ = dVar17;
  auVar40._12_4_ = (int)((ulong)-dVar74 >> 0x20);
  dVar26 = dVar53 * dVar18;
  dVar35 = dVar55 * dVar27;
  auVar1._8_4_ = SUB84(dVar22,0);
  auVar1._0_8_ = dVar21;
  auVar1._12_4_ = (int)((ulong)dVar42 >> 0x20);
  dVar47 = dVar58 * dVar69 - (dVar36 * dVar58 + -dVar69 * dVar15 + dVar36 * dVar15 + dVar26);
  dVar44 = dVar60 * dVar71 - (dVar71 * dVar21 + dVar67 * dVar23 + dVar67 * dVar21 + dVar35);
  dVar54 = dVar44 - dVar47;
  dVar62 = dVar35 + dVar54;
  dVar35 = (dVar35 - (dVar62 - (dVar62 - dVar35))) + (dVar54 - (dVar62 - dVar35));
  dVar52 = dVar35 - dVar26;
  dVar26 = (dVar35 - ((dVar35 - dVar52) + dVar52)) + ((dVar35 - dVar52) - dVar26);
  local_1418._8_4_ = SUB84(dVar26,0);
  local_1418._0_8_ = (dVar44 - (dVar54 + (dVar44 - dVar54))) + ((dVar44 - dVar54) - dVar47);
  local_1418._12_4_ = (int)((ulong)dVar26 >> 0x20);
  dVar54 = dVar62 + dVar52;
  local_1408 = (dVar62 - (dVar54 - (dVar54 - dVar62))) + (dVar52 - (dVar54 - dVar62));
  dVar35 = dVar48 * dVar53;
  dVar47 = dVar50 * dVar55;
  dStack_1780 = auVar39._8_8_;
  dVar44 = dVar69 * dVar73 - (((dVar35 - dVar65 * dVar34) - dVar34 * dVar69) - dVar73 * dVar65);
  dVar52 = dVar71 * dVar74 - (((dVar47 - dStack_1780) - dVar67 * dVar74) - dVar71 * dVar22);
  dVar22 = dVar44 - dVar52;
  dVar26 = dVar35 + dVar22;
  dVar35 = (dVar35 - (dVar26 - (dVar26 - dVar35))) + (dVar22 - (dVar26 - dVar35));
  dVar62 = dVar35 - dVar47;
  local_1438 = (dVar44 - (dVar22 + (dVar44 - dVar22))) + ((dVar44 - dVar22) - dVar52);
  dStack_1430 = (dVar35 - (dVar62 + (dVar35 - dVar62))) + ((dVar35 - dVar62) - dVar47);
  dVar44 = dVar26 + dVar62;
  local_1428._8_4_ = SUB84(dVar44,0);
  local_1428._0_8_ = (dVar26 - (dVar44 - (dVar44 - dVar26))) + (dVar62 - (dVar44 - dVar26));
  local_1428._12_4_ = (int)((ulong)dVar44 >> 0x20);
  dStack_1730 = auVar40._8_8_;
  dVar26 = dVar24 * dVar48;
  dVar22 = dVar32 * dVar50;
  dVar35 = dVar46 * dVar73 - (dVar73 * dVar33 + dVar17 * dVar34 + dVar33 * dVar34 + dVar26);
  dVar47 = dVar49 * dVar74 - (dVar49 * dVar42 + dStack_1730 * dVar41 + dVar42 * dVar41 + dVar22);
  dVar52 = dVar47 - dVar35;
  dVar62 = dVar22 + dVar52;
  dVar22 = (dVar22 - (dVar62 - (dVar62 - dVar22))) + (dVar52 - (dVar62 - dVar22));
  dVar42 = dVar22 - dVar26;
  local_14d8 = (dVar47 - (dVar52 + (dVar47 - dVar52))) + ((dVar47 - dVar52) - dVar35);
  dStack_14d0 = (dVar22 - ((dVar22 - dVar42) + dVar42)) + ((dVar22 - dVar42) - dVar26);
  dVar65 = dVar62 + dVar42;
  local_14c8 = (dVar62 - (dVar65 - (dVar65 - dVar62))) + (dVar42 - (dVar65 - dVar62));
  dVar52 = dVar55 * dVar24;
  dVar42 = dVar53 * dVar32;
  dVar35 = dVar71 * dVar46 - (dVar71 * dVar33 + dVar17 * dVar67 + dVar33 * dVar67 + dVar52);
  dVar47 = dVar69 * dVar49 - (dVar49 * dVar36 + -dVar69 * dVar41 + dVar36 * dVar41 + dVar42);
  dVar22 = dVar35 - dVar47;
  dVar26 = dVar52 + dVar22;
  dVar17 = (dVar52 - (dVar26 - (dVar26 - dVar52))) + (dVar22 - (dVar26 - dVar52));
  dVar52 = dVar17 - dVar42;
  local_14f8 = (dVar35 - (dVar22 + (dVar35 - dVar22))) + ((dVar35 - dVar22) - dVar47);
  dStack_14f0 = (dVar17 - (dVar52 + (dVar17 - dVar52))) + ((dVar17 - dVar52) - dVar42);
  dVar17 = dVar26 + dVar52;
  local_14e8._8_4_ = SUB84(dVar17,0);
  local_14e8._0_8_ = (dVar26 - (dVar17 - (dVar17 - dVar26))) + (dVar52 - (dVar17 - dVar26));
  local_14e8._12_4_ = (int)((ulong)dVar17 >> 0x20);
  dStack_16c0 = auVar1._8_8_;
  dStack_16a0 = auVar29._8_8_;
  dVar26 = dVar48 * dVar27;
  dVar22 = dVar50 * dStack_16a0;
  dVar21 = dVar60 * dVar73 - (dVar73 * dVar21 + dVar23 * dVar34 + dVar21 * dVar34 + dVar26);
  dVar15 = dVar58 * dVar74 -
           (dVar58 * dStack_16c0 + -dVar74 * dVar15 + dStack_16c0 * dVar15 + dVar22);
  dVar34 = dVar21 - dVar15;
  dVar35 = dVar26 + dVar34;
  dVar26 = (dVar26 - (dVar35 - (dVar35 - dVar26))) + (dVar34 - (dVar35 - dVar26));
  dVar47 = dVar26 - dVar22;
  local_1458 = (dVar21 - (dVar34 + (dVar21 - dVar34))) + ((dVar21 - dVar34) - dVar15);
  dStack_1450 = (dVar26 - (dVar47 + (dVar26 - dVar47))) + ((dVar26 - dVar47) - dVar22);
  dVar52 = dVar35 + dVar47;
  local_1448 = (dVar35 - (dVar52 - (dVar52 - dVar35))) + (dVar47 - (dVar52 - dVar35));
  dVar22 = pc[2] - dVar63;
  auVar2._8_4_ = SUB84(dVar61 - dVar63,0);
  auVar2._0_8_ = dVar22;
  auVar2._12_4_ = (int)((ulong)(dVar61 - dVar63) >> 0x20);
  dVar34 = dVar6 - dVar63;
  dVar15 = dVar16 - dVar63;
  auVar3._8_4_ = SUB84(dVar15,0);
  auVar3._0_8_ = dVar34;
  auVar3._12_4_ = (int)((ulong)dVar15 >> 0x20);
  dVar21 = cheight - eheight;
  dVar23 = dheight - eheight;
  auVar4._8_4_ = SUB84(bheight,0);
  auVar4._0_8_ = aheight;
  auVar4._12_4_ = (int)((ulong)bheight >> 0x20);
  dVar35 = aheight - eheight;
  auVar5._8_4_ = SUB84(bheight - eheight,0);
  auVar5._0_8_ = dVar35;
  auVar5._12_4_ = (int)((ulong)(bheight - eheight) >> 0x20);
  local_14c0 = dVar65;
  dStack_1440 = dVar52;
  local_1400 = dVar54;
  iVar9 = scale_expansion_zeroelim(4,&local_1438,dVar15,temp8a);
  iVar10 = scale_expansion_zeroelim(4,&local_1458,-dVar22,temp8b);
  dVar26 = auVar2._8_8_;
  iVar11 = scale_expansion_zeroelim(4,(double *)local_1418,dVar26,temp8c);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,temp8a,iVar10,temp8b,temp16);
  iVar9 = fast_expansion_sum_zeroelim(iVar11,temp8c,iVar9,temp16,temp24);
  iVar9 = scale_expansion_zeroelim(iVar9,temp24,-dVar35,adet);
  iVar10 = scale_expansion_zeroelim(4,&local_14d8,dVar22,temp8a);
  iVar11 = scale_expansion_zeroelim(4,&local_14f8,dVar26,temp8b);
  iVar12 = scale_expansion_zeroelim(4,&local_1438,dVar34,temp8c);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,temp8a,iVar11,temp8b,temp16);
  iVar10 = fast_expansion_sum_zeroelim(iVar12,temp8c,iVar10,temp16,temp24);
  dStack_1740 = auVar5._8_8_;
  iVar10 = scale_expansion_zeroelim(iVar10,temp24,dStack_1740,bdet);
  iVar11 = scale_expansion_zeroelim(4,&local_14b8,dVar26,temp8a);
  iVar12 = scale_expansion_zeroelim(4,&local_1458,dVar34,temp8b);
  iVar13 = scale_expansion_zeroelim(4,&local_14d8,dVar15,temp8c);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,temp8a,iVar12,temp8b,temp16);
  iVar11 = fast_expansion_sum_zeroelim(iVar13,temp8c,iVar11,temp16,temp24);
  iVar11 = scale_expansion_zeroelim(iVar11,temp24,-dVar21,cdet);
  iVar12 = scale_expansion_zeroelim(4,(double *)local_1418,dVar34,temp8a);
  iVar13 = scale_expansion_zeroelim(4,&local_14f8,-dVar15,temp8b);
  elen = scale_expansion_zeroelim(4,&local_14b8,dVar22,temp8c);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,temp8a,iVar13,temp8b,temp16);
  iVar12 = fast_expansion_sum_zeroelim(elen,temp8c,iVar12,temp16,temp24);
  iVar12 = scale_expansion_zeroelim(iVar12,temp24,dVar23,ddet);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,adet,iVar10,bdet,abdet);
  iVar10 = fast_expansion_sum_zeroelim(iVar11,cdet,iVar12,ddet,cddet);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,abdet,iVar10,cddet,fin1);
  dVar47 = estimate(iVar9,fin1);
  if ((dVar47 < isperrboundB * permanent) && (-dVar47 < isperrboundB * permanent)) {
    dVar33 = (dVar64 - (dVar24 + (dVar64 - dVar24))) + ((dVar64 - dVar24) - dVar57);
    dVar36 = (dVar43 - (dVar32 + (dVar43 - dVar32))) + ((dVar43 - dVar32) - dVar56);
    dVar42 = (dVar45 - (dVar27 + (dVar45 - dVar27))) + ((dVar45 - dVar27) - dVar57);
    dVar51 = (dVar51 - (dStack_16a0 + (dVar51 - dStack_16a0))) + ((dVar51 - dStack_16a0) - dVar56);
    dVar64 = dVar59 - dVar22;
    dVar43 = (dVar66 - (dVar53 + (dVar66 - dVar53))) + ((dVar66 - dVar53) - dVar57);
    dVar45 = (dVar68 - (dVar55 + (dVar68 - dVar55))) + ((dVar68 - dVar55) - dVar56);
    dStack_17a0 = auVar3._8_8_;
    dVar56 = (dVar72 - (dVar48 + (dVar72 - dVar48))) + ((dVar72 - dVar48) - dVar56);
    dVar57 = (dVar70 - (dVar50 + (dVar70 - dVar50))) + ((dVar70 - dVar50) - dVar57);
    dStack_1720 = auVar4._8_8_;
    dVar70 = (dVar59 - (dVar22 + dVar64)) + (dVar64 - dVar63);
    dVar72 = (dVar61 - (dVar26 + (dVar61 - dVar26))) + ((dVar61 - dVar26) - dVar63);
    dVar66 = (dVar6 - (dVar34 + (dVar6 - dVar34))) + ((dVar6 - dVar34) - dVar63);
    dVar68 = (dVar16 - (dStack_17a0 + (dVar16 - dStack_17a0))) + ((dVar16 - dStack_17a0) - dVar63);
    dVar16 = (aheight - (dVar35 + (aheight - dVar35))) + ((aheight - dVar35) - eheight);
    dVar61 = (dStack_1720 - (dStack_1740 + (dStack_1720 - dStack_1740))) +
             ((dStack_1720 - dStack_1740) - eheight);
    dVar63 = (cheight - (dVar21 + (cheight - dVar21))) + ((cheight - dVar21) - eheight);
    dVar64 = (dheight - (dVar23 + (dheight - dVar23))) + ((dheight - dVar23) - eheight);
    auVar28._8_8_ = -(ulong)(dVar68 != 0.0);
    auVar28._0_8_ = -(ulong)(dVar51 != 0.0);
    auVar37._8_8_ = -(ulong)(dVar45 != 0.0);
    auVar37._0_8_ = -(ulong)(dVar43 != 0.0);
    auVar29 = packssdw(auVar28,auVar37);
    auVar19._8_8_ = -(ulong)(dVar42 != 0.0);
    auVar19._0_8_ = -(ulong)(dVar66 != 0.0);
    auVar38._8_8_ = -(ulong)(dVar36 != 0.0);
    auVar38._0_8_ = -(ulong)(dVar33 != 0.0);
    auVar39 = packssdw(auVar38,auVar19);
    auVar40 = packssdw(auVar39,auVar29);
    auVar30._8_8_ = -(ulong)(dVar72 != 0.0);
    auVar30._0_8_ = -(ulong)(dVar56 != 0.0);
    auVar20._8_8_ = -(ulong)(dVar57 != 0.0);
    auVar20._0_8_ = -(ulong)(dVar70 != 0.0);
    auVar29 = packssdw(auVar20,auVar30);
    auVar31._8_8_ = -(ulong)(dVar61 != 0.0);
    auVar31._0_8_ = -(ulong)(dVar16 != 0.0);
    lVar14 = -(ulong)(dVar64 != 0.0);
    auVar8._8_4_ = (int)lVar14;
    auVar8._0_8_ = -(ulong)(dVar63 != 0.0);
    auVar8._12_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar39 = packssdw(auVar31,auVar8);
    auVar29 = packssdw(auVar29,auVar39);
    auVar29 = packsswb(auVar40,auVar29);
    if ((((((((((((((((auVar29 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar29 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar29 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar29 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar29 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar29 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar29 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar29 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar29 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar29 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar29 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar29[0xf] < '\0')
    {
      dVar6 = permanent * isperrboundC + ABS(dVar47) * resulterrbound;
      dVar18 = (dVar51 * dVar24 + dVar18 * dVar33) - (dVar42 * dVar32 + dVar27 * dVar36);
      dVar62 = (dVar27 * dVar45 + dVar42 * dVar55) - (dStack_16a0 * dVar43 + dVar51 * dVar53);
      dVar41 = (dVar53 * dVar56 + dVar43 * dVar48) - (dVar55 * dVar57 + dVar45 * dVar50);
      dVar59 = (dVar50 * dVar36 + dVar32 * dVar57) - (dVar48 * dVar33 + dVar24 * dVar56);
      dVar43 = (dVar45 * dVar24 + dVar55 * dVar33) - (dVar43 * dVar32 + dVar53 * dVar36);
      dVar27 = (dVar27 * dVar56 + dVar48 * dVar42) - (dStack_16a0 * dVar57 + dVar50 * dVar51);
      dVar47 = ((dStack_1740 *
                 (dVar66 * dVar44 + dVar70 * dVar65 + dVar72 * dVar17 +
                 dVar34 * dVar41 + dVar22 * dVar59 + dVar26 * dVar43) +
                dVar23 * (dVar70 * dVar25 + (dVar66 * dVar54 - dVar17 * dVar68) +
                         dVar22 * dVar18 + dVar34 * dVar62 + dVar43 * -dVar15)) -
               (dVar35 * (dVar72 * dVar54 + (dVar68 * dVar44 - dVar52 * dVar70) +
                         dVar62 * dVar26 + dVar41 * dVar15 + dVar27 * -dVar22) +
               dVar21 * (dVar68 * dVar65 + dVar72 * dVar25 + dVar66 * dVar52 +
                        dVar59 * dVar15 + dVar18 * dVar26 + dVar34 * dVar27))) +
               ((dVar61 * (dVar34 * dVar44 + dVar22 * dVar65 + dVar26 * dVar17) +
                dVar64 * (dVar22 * dVar25 + dVar34 * dVar54 + dVar17 * -dVar15)) -
               (dVar16 * (dVar54 * dVar26 + dVar44 * dVar15 + -dVar22 * dVar52) +
               dVar63 * (dVar65 * dVar15 + dVar26 * dVar25 + dVar52 * dVar34))) + dVar47;
      if ((dVar47 < dVar6) && (-dVar47 < dVar6)) {
        dVar16 = orient4dexact(pa,pb,pc,pd,pe,aheight,bheight,cheight,dheight,eheight);
        return dVar16;
      }
    }
  }
  return dVar47;
}

Assistant:

REAL orient4dadapt(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe,
                   REAL aheight, REAL bheight, REAL cheight, REAL dheight, 
                   REAL eheight, REAL permanent)
{
  INEXACT REAL aex, bex, cex, dex, aey, bey, cey, dey, aez, bez, cez, dez;
  INEXACT REAL aeheight, beheight, ceheight, deheight;
  REAL det, errbound;

  INEXACT REAL aexbey1, bexaey1, bexcey1, cexbey1;
  INEXACT REAL cexdey1, dexcey1, dexaey1, aexdey1;
  INEXACT REAL aexcey1, cexaey1, bexdey1, dexbey1;
  REAL aexbey0, bexaey0, bexcey0, cexbey0;
  REAL cexdey0, dexcey0, dexaey0, aexdey0;
  REAL aexcey0, cexaey0, bexdey0, dexbey0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  INEXACT REAL ab3, bc3, cd3, da3, ac3, bd3;
  REAL abeps, bceps, cdeps, daeps, aceps, bdeps;
  REAL temp8a[8], temp8b[8], temp8c[8], temp16[16], temp24[24];
  int temp8alen, temp8blen, temp8clen, temp16len, temp24len;
  REAL adet[48], bdet[48], cdet[48], ddet[48];
  int alen, blen, clen, dlen;
  REAL abdet[96], cddet[96];
  int ablen, cdlen;
  REAL fin1[192];
  int finlength;

  REAL aextail, bextail, cextail, dextail;
  REAL aeytail, beytail, ceytail, deytail;
  REAL aeztail, beztail, ceztail, deztail;
  REAL aeheighttail, beheighttail, ceheighttail, deheighttail;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  aex = (REAL) (pa[0] - pe[0]);
  bex = (REAL) (pb[0] - pe[0]);
  cex = (REAL) (pc[0] - pe[0]);
  dex = (REAL) (pd[0] - pe[0]);
  aey = (REAL) (pa[1] - pe[1]);
  bey = (REAL) (pb[1] - pe[1]);
  cey = (REAL) (pc[1] - pe[1]);
  dey = (REAL) (pd[1] - pe[1]);
  aez = (REAL) (pa[2] - pe[2]);
  bez = (REAL) (pb[2] - pe[2]);
  cez = (REAL) (pc[2] - pe[2]);
  dez = (REAL) (pd[2] - pe[2]);
  aeheight = (REAL) (aheight - eheight);
  beheight = (REAL) (bheight - eheight);
  ceheight = (REAL) (cheight - eheight);
  deheight = (REAL) (dheight - eheight);

  Two_Product(aex, bey, aexbey1, aexbey0);
  Two_Product(bex, aey, bexaey1, bexaey0);
  Two_Two_Diff(aexbey1, aexbey0, bexaey1, bexaey0, ab3, ab[2], ab[1], ab[0]);
  ab[3] = ab3;

  Two_Product(bex, cey, bexcey1, bexcey0);
  Two_Product(cex, bey, cexbey1, cexbey0);
  Two_Two_Diff(bexcey1, bexcey0, cexbey1, cexbey0, bc3, bc[2], bc[1], bc[0]);
  bc[3] = bc3;

  Two_Product(cex, dey, cexdey1, cexdey0);
  Two_Product(dex, cey, dexcey1, dexcey0);
  Two_Two_Diff(cexdey1, cexdey0, dexcey1, dexcey0, cd3, cd[2], cd[1], cd[0]);
  cd[3] = cd3;

  Two_Product(dex, aey, dexaey1, dexaey0);
  Two_Product(aex, dey, aexdey1, aexdey0);
  Two_Two_Diff(dexaey1, dexaey0, aexdey1, aexdey0, da3, da[2], da[1], da[0]);
  da[3] = da3;

  Two_Product(aex, cey, aexcey1, aexcey0);
  Two_Product(cex, aey, cexaey1, cexaey0);
  Two_Two_Diff(aexcey1, aexcey0, cexaey1, cexaey0, ac3, ac[2], ac[1], ac[0]);
  ac[3] = ac3;

  Two_Product(bex, dey, bexdey1, bexdey0);
  Two_Product(dex, bey, dexbey1, dexbey0);
  Two_Two_Diff(bexdey1, bexdey0, dexbey1, dexbey0, bd3, bd[2], bd[1], bd[0]);
  bd[3] = bd3;

  temp8alen = scale_expansion_zeroelim(4, cd, bez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -cez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, bc, dez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  alen = scale_expansion_zeroelim(temp24len, temp24, -aeheight, adet);

  temp8alen = scale_expansion_zeroelim(4, da, cez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, dez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, cd, aez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  blen = scale_expansion_zeroelim(temp24len, temp24, beheight, bdet);

  temp8alen = scale_expansion_zeroelim(4, ab, dez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, aez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, da, bez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  clen = scale_expansion_zeroelim(temp24len, temp24, -ceheight, cdet);

  temp8alen = scale_expansion_zeroelim(4, bc, aez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -bez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, ab, cez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  dlen = scale_expansion_zeroelim(temp24len, temp24, deheight, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  finlength = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, fin1);

  det = estimate(finlength, fin1);
  errbound = isperrboundB * permanent;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pe[0], aex, aextail);
  Two_Diff_Tail(pa[1], pe[1], aey, aeytail);
  Two_Diff_Tail(pa[2], pe[2], aez, aeztail);
  Two_Diff_Tail(aheight, eheight, aeheight, aeheighttail);
  Two_Diff_Tail(pb[0], pe[0], bex, bextail);
  Two_Diff_Tail(pb[1], pe[1], bey, beytail);
  Two_Diff_Tail(pb[2], pe[2], bez, beztail);
  Two_Diff_Tail(bheight, eheight, beheight, beheighttail);
  Two_Diff_Tail(pc[0], pe[0], cex, cextail);
  Two_Diff_Tail(pc[1], pe[1], cey, ceytail);
  Two_Diff_Tail(pc[2], pe[2], cez, ceztail);
  Two_Diff_Tail(cheight, eheight, ceheight, ceheighttail);
  Two_Diff_Tail(pd[0], pe[0], dex, dextail);
  Two_Diff_Tail(pd[1], pe[1], dey, deytail);
  Two_Diff_Tail(pd[2], pe[2], dez, deztail);
  Two_Diff_Tail(dheight, eheight, deheight, deheighttail);
  if ((aextail == 0.0) && (aeytail == 0.0) && (aeztail == 0.0)
      && (bextail == 0.0) && (beytail == 0.0) && (beztail == 0.0)
      && (cextail == 0.0) && (ceytail == 0.0) && (ceztail == 0.0)
      && (dextail == 0.0) && (deytail == 0.0) && (deztail == 0.0)
      && (aeheighttail == 0.0) && (beheighttail == 0.0)
      && (ceheighttail == 0.0) && (deheighttail == 0.0)) {
    return det;
  }

  errbound = isperrboundC * permanent + resulterrbound * Absolute(det);
  abeps = (aex * beytail + bey * aextail)
        - (aey * bextail + bex * aeytail);
  bceps = (bex * ceytail + cey * bextail)
        - (bey * cextail + cex * beytail);
  cdeps = (cex * deytail + dey * cextail)
        - (cey * dextail + dex * ceytail);
  daeps = (dex * aeytail + aey * dextail)
        - (dey * aextail + aex * deytail);
  aceps = (aex * ceytail + cey * aextail)
        - (aey * cextail + cex * aeytail);
  bdeps = (bex * deytail + dey * bextail)
        - (bey * dextail + dex * beytail);
  det += ((beheight
           * ((cez * daeps + dez * aceps + aez * cdeps)
              + (ceztail * da3 + deztail * ac3 + aeztail * cd3))
           + deheight
           * ((aez * bceps - bez * aceps + cez * abeps)
              + (aeztail * bc3 - beztail * ac3 + ceztail * ab3)))
          - (aeheight
           * ((bez * cdeps - cez * bdeps + dez * bceps)
              + (beztail * cd3 - ceztail * bd3 + deztail * bc3))
           + ceheight
           * ((dez * abeps + aez * bdeps + bez * daeps)
              + (deztail * ab3 + aeztail * bd3 + beztail * da3))))
       + ((beheighttail * (cez * da3 + dez * ac3 + aez * cd3)
           + deheighttail * (aez * bc3 - bez * ac3 + cez * ab3))
          - (aeheighttail * (bez * cd3 - cez * bd3 + dez * bc3)
           + ceheighttail * (dez * ab3 + aez * bd3 + bez * da3)));
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  return orient4dexact(pa, pb, pc, pd, pe,
                       aheight, bheight, cheight, dheight, eheight);
}